

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crossings.cc
# Opt level: O0

S2Point * S2::S2PointFromExact(S2Point *__return_storage_ptr__,Vector3_xf *xf)

{
  bool bVar1;
  int *piVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  ExactFloat local_110;
  ExactFloat local_100;
  ExactFloat local_f0;
  ExactFloat local_e0;
  ExactFloat local_d0;
  ExactFloat local_c0;
  Vector3<double> local_b0;
  ExactFloat local_98;
  int local_84;
  ExactFloat local_80;
  int local_70;
  int local_6c;
  int i;
  int exp;
  ExactFloat local_58 [2];
  ExactFloat local_38;
  undefined1 local_28 [8];
  S2Point x;
  Vector3_xf *xf_local;
  
  x.c_[2] = (VType)xf;
  util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
            ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_38,(int)xf);
  dVar3 = ExactFloat::ToDouble(&local_38);
  util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
            ((BasicVector<Vector3,_ExactFloat,_3UL> *)local_58,SUB84(x.c_[2],0));
  dVar4 = ExactFloat::ToDouble(local_58);
  util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
            ((BasicVector<Vector3,_ExactFloat,_3UL> *)&i,SUB84(x.c_[2],0));
  dVar5 = ExactFloat::ToDouble((ExactFloat *)&i);
  Vector3<double>::Vector3((Vector3<double> *)local_28,dVar3,dVar4,dVar5);
  ExactFloat::~ExactFloat((ExactFloat *)&i);
  ExactFloat::~ExactFloat(local_58);
  ExactFloat::~ExactFloat(&local_38);
  dVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                    ((BasicVector<Vector3,_double,_3UL> *)local_28);
  if (dVar3 <= 0.0) {
    local_6c = -0xbebc201;
    for (local_70 = 0; local_70 < 3; local_70 = local_70 + 1) {
      util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_80,SUB84(x.c_[2],0));
      bVar1 = ExactFloat::is_normal(&local_80);
      ExactFloat::~ExactFloat(&local_80);
      if (bVar1) {
        util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                  ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_98,SUB84(x.c_[2],0));
        ExactFloat::exp(&local_98,__x);
        piVar2 = std::max<int>(&local_6c,&local_84);
        local_6c = *piVar2;
        ExactFloat::~ExactFloat(&local_98);
      }
    }
    if (local_6c < -200000000) {
      Vector3<double>::Vector3(__return_storage_ptr__,0.0,0.0,0.0);
    }
    else {
      util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_d0,SUB84(x.c_[2],0));
      ldexp(__x_00,(int)&local_c0);
      dVar3 = ExactFloat::ToDouble(&local_c0);
      util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_f0,SUB84(x.c_[2],0));
      ldexp(__x_01,(int)&local_e0);
      dVar4 = ExactFloat::ToDouble(&local_e0);
      util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_110,SUB84(x.c_[2],0));
      ldexp(__x_02,(int)&local_100);
      dVar5 = ExactFloat::ToDouble(&local_100);
      Vector3<double>::Vector3(&local_b0,dVar3,dVar4,dVar5);
      util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Normalize
                (__return_storage_ptr__,(BasicVector<Vector3,_double,_3UL> *)&local_b0);
      ExactFloat::~ExactFloat(&local_100);
      ExactFloat::~ExactFloat(&local_110);
      ExactFloat::~ExactFloat(&local_e0);
      ExactFloat::~ExactFloat(&local_f0);
      ExactFloat::~ExactFloat(&local_c0);
      ExactFloat::~ExactFloat(&local_d0);
    }
  }
  else {
    util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Normalize
              (__return_storage_ptr__,(BasicVector<Vector3,_double,_3UL> *)local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

static S2Point S2PointFromExact(const Vector3_xf& xf) {
  // If all components of "x" have absolute value less than about 1e-154,
  // then x.Norm2() is zero in double precision due to underflow.  Therefore
  // we need to scale "x" by an appropriate power of 2 before the conversion.
  S2Point x(xf[0].ToDouble(), xf[1].ToDouble(), xf[2].ToDouble());
  if (x.Norm2() > 0) return x.Normalize();

  // Scale so that the largest component magnitude is in the range [0.5, 1).
  int exp = ExactFloat::kMinExp - 1;
  for (int i = 0; i < 3; ++i) {
    if (xf[i].is_normal()) exp = std::max(exp, xf[i].exp());
  }
  if (exp < ExactFloat::kMinExp) {
    return S2Point(0, 0, 0);
  }
  return S2Point(ldexp(xf[0], -exp).ToDouble(),
                 ldexp(xf[1], -exp).ToDouble(),
                 ldexp(xf[2], -exp).ToDouble()).Normalize();
}